

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Address.cpp
# Opt level: O0

istream * operator>>(istream *in,Address *a)

{
  string local_88 [8];
  string street;
  string local_68 [8];
  string city;
  string local_38 [8];
  string country;
  Address *a_local;
  istream *in_local;
  
  std::__cxx11::string::string(local_38);
  std::operator>>(in,local_38);
  std::__cxx11::string::string(local_68);
  std::operator>>(in,local_68);
  std::__cxx11::string::string(local_88);
  std::operator>>(in,local_88);
  std::__cxx11::string::operator=((string *)a,local_38);
  std::__cxx11::string::operator=((string *)&a->city,local_68);
  std::__cxx11::string::operator=((string *)&a->street,local_88);
  std::__cxx11::string::~string(local_88);
  std::__cxx11::string::~string(local_68);
  std::__cxx11::string::~string(local_38);
  return in;
}

Assistant:

istream &operator>>(istream &in, Address &a) {
    // take each string line by line or separated by space
    string country;
    in >> country;
    string city;
    in >> city;
    string street;
    in >> street;
    a.country = country;
    a.city = city;
    a.street = street;
    return in;
}